

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<33U,_unsigned_char,_unsigned_int,_int>::resize
          (prevector<33U,_unsigned_char,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  uint uVar5;
  size_t __len;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = this->_size;
  uVar2 = uVar3 - 0x22;
  if (uVar3 < 0x22) {
    uVar2 = uVar3;
  }
  uVar5 = new_size - uVar2;
  if (uVar5 != 0) {
    if (new_size < uVar2) {
      ppVar4 = this;
      if (0x21 < uVar3) {
        ppVar4 = (prevector<33U,_unsigned_char,_unsigned_int,_int> *)
                 (this->_union).indirect_contents.indirect;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        erase(this,(uchar *)((long)&ppVar4->_union + (long)(int)new_size),
              (uchar *)((long)&ppVar4->_union + (long)(int)uVar2));
        return;
      }
      goto LAB_00a6b1ad;
    }
    if (uVar3 < 0x22) {
      uVar3 = 0x21;
    }
    else {
      uVar3 = (this->_union).indirect_contents.capacity;
    }
    if (uVar3 < new_size) {
      change_capacity(this,new_size);
    }
    ppVar4 = this;
    if (0x21 < this->_size) {
      ppVar4 = (prevector<33U,_unsigned_char,_unsigned_int,_int> *)
               (this->_union).indirect_contents.indirect;
    }
    memset((void *)((long)&ppVar4->_union + (long)(int)uVar2),0,(ulong)uVar5);
    this->_size = this->_size + uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00a6b1ad:
  __stack_chk_fail();
}

Assistant:

bool is_direct() const { return _size <= N; }